

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spin_mutex.h
# Opt level: O0

void __thiscall spin_mutex_t::unlock(spin_mutex_t *this)

{
  undefined1 *in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  *in_RDI = 0;
  return;
}

Assistant:

void unlock() noexcept {
    lock_.clear(std::memory_order_release);
  }